

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dropt.c
# Opt level: O0

dropt_char * safe_strncat(dropt_char *dest,size_t destSize,dropt_char *s)

{
  size_t sVar1;
  char *local_28;
  dropt_char *s_local;
  size_t destSize_local;
  dropt_char *dest_local;
  
  if (dest == (dropt_char *)0x0) {
    __assert_fail("dest != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/test_dropt.c"
                  ,0xda,"dropt_char *safe_strncat(dropt_char *, size_t, const dropt_char *)");
  }
  if (s == (dropt_char *)0x0) {
    __assert_fail("s != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/test_dropt.c"
                  ,0xdb,"dropt_char *safe_strncat(dropt_char *, size_t, const dropt_char *)");
  }
  local_28 = dest;
  if (destSize != 0) {
    sVar1 = strlen(dest);
    local_28 = strncat(dest,s,(destSize - sVar1) - 1);
  }
  return local_28;
}

Assistant:

dropt_char*
safe_strncat(dropt_char* dest, size_t destSize, const dropt_char* s)
{
    assert(dest != NULL);
    assert(s != NULL);
    return (destSize == 0)
           ? dest
           : tcsncat(dest, s, destSize - dropt_strlen(dest) - 1);
}